

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_key_usage_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::ExtendedKeyUsageTest_ExtraData_Test::TestBody
          (ExtendedKeyUsageTest_ExtraData_Test *this)

{
  bool bVar1;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *in_RCX;
  char *in_R9;
  Input extension_value;
  AssertHelper AStack_98;
  Message local_90;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> ekus;
  string local_68;
  AssertionResult gtest_ar_;
  uint8_t extra_data [25];
  
  builtin_memcpy(extra_data + 0x10,"\x01\x05\x05\a\x03\x02\x02\x01\x01",9);
  builtin_memcpy(extra_data,"0\x14\x06\b+\x06\x01\x05\x05\a\x03\x01\x06\b+\x06",0x10);
  ekus.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ekus.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ekus.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  extension_value.data_.size_ = (size_t)&ekus;
  extension_value.data_.data_ = (uchar *)0x19;
  bVar1 = ParseEKUExtension((bssl *)extra_data,extension_value,in_RCX);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&gtest_ar_,
               (AssertionResult *)"ParseEKUExtension(der::Input(extra_data), &ekus)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/extended_key_usage_unittest.cc"
               ,0x7a,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&AStack_98);
    ::std::__cxx11::string::~string((string *)&local_68);
    if (local_90.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_90.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  ::std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ::std::_Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~_Vector_base
            (&ekus.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>);
  return;
}

Assistant:

TEST(ExtendedKeyUsageTest, ExtraData) {
  // clang-format off
  const uint8_t extra_data[] = {
      0x30, 0x14,  // SEQUENCE (20 bytes)
      0x06, 0x08,  // OBJECT IDENTIFIER (8 bytes)
      0x2B, 0x06, 0x01, 0x05, 0x05, 0x07, 0x03, 0x01,  // 1.3.6.1.5.5.7.3.1
      0x06, 0x08,  // OBJECT IDENTIFIER (8 bytes)
      0x2B, 0x06, 0x01, 0x05, 0x05, 0x07, 0x03, 0x02,  // 1.3.6.1.5.5.7.3.2
      // end of SEQUENCE
      0x02, 0x01,  // INTEGER (1 byte)
      0x01  // 1
  };
  // clang-format on

  std::vector<der::Input> ekus;
  EXPECT_FALSE(ParseEKUExtension(der::Input(extra_data), &ekus));
}